

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

iterator __thiscall
llvm::SmallVectorImpl<char>::erase(SmallVectorImpl<char> *this,const_iterator CS,const_iterator CE)

{
  const_iterator pcVar1;
  ptrdiff_t _Num;
  size_t __n;
  
  pcVar1 = (const_iterator)
           (this->super_SmallVectorTemplateBase<char,_true>).
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  if (CS < pcVar1) {
    __assert_fail("S >= this->begin() && \"Range to erase is out of bounds.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                  ,0x1d1,
                  "iterator llvm::SmallVectorImpl<char>::erase(const_iterator, const_iterator) [T = char]"
                 );
  }
  if (CE < CS) {
    __assert_fail("S <= E && \"Trying to erase invalid range.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                  ,0x1d2,
                  "iterator llvm::SmallVectorImpl<char>::erase(const_iterator, const_iterator) [T = char]"
                 );
  }
  __n = (long)(pcVar1 + (this->super_SmallVectorTemplateBase<char,_true>).
                        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size) -
        (long)CE;
  if (pcVar1 + (this->super_SmallVectorTemplateBase<char,_true>).
               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size < CE) {
    __assert_fail("E <= this->end() && \"Trying to erase past the end.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                  ,0x1d3,
                  "iterator llvm::SmallVectorImpl<char>::erase(const_iterator, const_iterator) [T = char]"
                 );
  }
  if (__n != 0) {
    memmove(CS,CE,__n);
    pcVar1 = (const_iterator)
             (this->super_SmallVectorTemplateBase<char,_true>).
             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  }
  if (CS + (__n - (long)pcVar1) <=
      (const_iterator)
      (ulong)(this->super_SmallVectorTemplateBase<char,_true>).
             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity) {
    (this->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.Size = (uint)(CS + (__n - (long)pcVar1));
    return CS;
  }
  __assert_fail("Size <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

LLVM_ATTRIBUTE_ALWAYS_INLINE
  iterator begin() { return (iterator)this->BeginX; }